

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
type_caster<std::tuple<int,int,std::vector<float,std::allocator<float>>const&,float,float,float,std::vector<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::allocator<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>>const&,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>const&>,void>
::load<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul>
          (type_caster<std::tuple<int,int,std::vector<float,std::allocator<float>>const&,float,float,float,std::vector<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::allocator<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>>const&,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>const&>,void>
           *this,PyObject *src,byte convert)

{
  int iVar1;
  __tuple_element_t<0UL,_tuple<type_caster<int,_void>,_type_caster<int,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<vector<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>,_allocator<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>_>_>,_void>,_type_caster<vector<vector<unsigned_char,_allocator<unsigned_char>_>,_allocator<vector<unsigned_char,_allocator<unsigned_char>_>_>_>,_void>_>_>
  *this_00;
  PyObject **ppPVar2;
  __tuple_element_t<1UL,_tuple<type_caster<int,_void>,_type_caster<int,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<vector<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>,_allocator<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>_>_>,_void>,_type_caster<vector<vector<unsigned_char,_allocator<unsigned_char>_>,_allocator<vector<unsigned_char,_allocator<unsigned_char>_>_>_>,_void>_>_>
  *this_01;
  __tuple_element_t<2UL,_tuple<type_caster<int,_void>,_type_caster<int,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<vector<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>,_allocator<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>_>_>,_void>,_type_caster<vector<vector<unsigned_char,_allocator<unsigned_char>_>,_allocator<vector<unsigned_char,_allocator<unsigned_char>_>_>_>,_void>_>_>
  *this_02;
  __tuple_element_t<3UL,_tuple<type_caster<int,_void>,_type_caster<int,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<vector<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>,_allocator<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>_>_>,_void>,_type_caster<vector<vector<unsigned_char,_allocator<unsigned_char>_>,_allocator<vector<unsigned_char,_allocator<unsigned_char>_>_>_>,_void>_>_>
  *this_03;
  __tuple_element_t<4UL,_tuple<type_caster<int,_void>,_type_caster<int,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<vector<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>,_allocator<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>_>_>,_void>,_type_caster<vector<vector<unsigned_char,_allocator<unsigned_char>_>,_allocator<vector<unsigned_char,_allocator<unsigned_char>_>_>_>,_void>_>_>
  *this_04;
  __tuple_element_t<5UL,_tuple<type_caster<int,_void>,_type_caster<int,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<vector<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>,_allocator<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>_>_>,_void>,_type_caster<vector<vector<unsigned_char,_allocator<unsigned_char>_>,_allocator<vector<unsigned_char,_allocator<unsigned_char>_>_>_>,_void>_>_>
  *this_05;
  __tuple_element_t<6UL,_tuple<type_caster<int,_void>,_type_caster<int,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<vector<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>,_allocator<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>_>_>,_void>,_type_caster<vector<vector<unsigned_char,_allocator<unsigned_char>_>,_allocator<vector<unsigned_char,_allocator<unsigned_char>_>_>_>,_void>_>_>
  *this_06;
  __tuple_element_t<7UL,_tuple<type_caster<int,_void>,_type_caster<int,_void>,_type_caster<vector<float,_allocator<float>_>,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<vector<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>,_allocator<vector<vector<float,_allocator<float>_>,_allocator<vector<float,_allocator<float>_>_>_>_>_>,_void>,_type_caster<vector<vector<unsigned_char,_allocator<unsigned_char>_>,_allocator<vector<unsigned_char,_allocator<unsigned_char>_>_>_>,_void>_>_>
  *this_07;
  iterator pvVar3;
  bool r;
  iterator __end0;
  iterator __begin0;
  array<bool,_8UL> *__range3;
  handle local_70;
  handle local_68;
  handle local_60;
  handle local_58;
  handle local_50;
  handle local_48;
  handle local_40;
  array<bool,_8UL> local_31;
  array<bool,_8UL> success;
  bool convert_local;
  type_caster<std::tuple<int,_int,_const_std::vector<float,_std::allocator<float>_>_&,_float,_float,_float,_const_std::vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_&,_const_std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_&>,_void>
  *this_local;
  handle local_18;
  handle src_local;
  
  success._M_elems[0] = (bool)(convert & 1);
  unique0x10000664 = this;
  local_18.m_ptr = src;
  this_00 = std::
            get<0ul,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::allocator<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>>,void>,pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>>
                      ((tuple<pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>,_void>,_pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_void>_>
                        *)this);
  ppPVar2 = handle::ptr(&local_18);
  iVar1 = PyType_HasFeature((*ppPVar2)->ob_type,0x4000000);
  if (iVar1 == 0) {
    __assert_fail("PyTuple_Check(src.ptr())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/cast.h"
                  ,0x300,
                  "bool pybind11::detail::type_caster<std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>>::load(handle, bool, index_sequence<Indices...>) [type = std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>, SFINAE = void, Indices = <0UL, 1UL, 2UL, 3UL, 4UL, 5UL, 6UL, 7UL>]"
                 );
  }
  ppPVar2 = handle::ptr(&local_18);
  handle::handle(&local_40,(PyObject *)(*ppPVar2)[1].ob_type);
  local_31._M_elems[0] =
       type_caster<int,_void>::load(this_00,local_40,(bool)(success._M_elems[0] & 1));
  this_01 = std::
            get<1ul,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::allocator<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>>,void>,pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>>
                      ((tuple<pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>,_void>,_pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_void>_>
                        *)this);
  ppPVar2 = handle::ptr(&local_18);
  iVar1 = PyType_HasFeature((*ppPVar2)->ob_type,0x4000000);
  if (iVar1 == 0) {
    __assert_fail("PyTuple_Check(src.ptr())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/cast.h"
                  ,0x300,
                  "bool pybind11::detail::type_caster<std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>>::load(handle, bool, index_sequence<Indices...>) [type = std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>, SFINAE = void, Indices = <0UL, 1UL, 2UL, 3UL, 4UL, 5UL, 6UL, 7UL>]"
                 );
  }
  ppPVar2 = handle::ptr(&local_18);
  handle::handle(&local_48,(PyObject *)(*ppPVar2)[2].ob_refcnt);
  local_31._M_elems[1] =
       type_caster<int,_void>::load(this_01,local_48,(bool)(success._M_elems[0] & 1));
  this_02 = std::
            get<2ul,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::allocator<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>>,void>,pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>>
                      ((tuple<pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>,_void>,_pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_void>_>
                        *)this);
  ppPVar2 = handle::ptr(&local_18);
  iVar1 = PyType_HasFeature((*ppPVar2)->ob_type,0x4000000);
  if (iVar1 == 0) {
    __assert_fail("PyTuple_Check(src.ptr())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/cast.h"
                  ,0x300,
                  "bool pybind11::detail::type_caster<std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>>::load(handle, bool, index_sequence<Indices...>) [type = std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>, SFINAE = void, Indices = <0UL, 1UL, 2UL, 3UL, 4UL, 5UL, 6UL, 7UL>]"
                 );
  }
  ppPVar2 = handle::ptr(&local_18);
  handle::handle(&local_50,(PyObject *)(*ppPVar2)[2].ob_type);
  local_31._M_elems[2] =
       list_caster<std::vector<float,_std::allocator<float>_>,_float>::load
                 (&this_02->super_list_caster<std::vector<float,_std::allocator<float>_>,_float>,
                  local_50,(bool)(success._M_elems[0] & 1));
  this_03 = std::
            get<3ul,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::allocator<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>>,void>,pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>>
                      ((tuple<pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>,_void>,_pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_void>_>
                        *)this);
  ppPVar2 = handle::ptr(&local_18);
  iVar1 = PyType_HasFeature((*ppPVar2)->ob_type,0x4000000);
  if (iVar1 == 0) {
    __assert_fail("PyTuple_Check(src.ptr())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/cast.h"
                  ,0x300,
                  "bool pybind11::detail::type_caster<std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>>::load(handle, bool, index_sequence<Indices...>) [type = std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>, SFINAE = void, Indices = <0UL, 1UL, 2UL, 3UL, 4UL, 5UL, 6UL, 7UL>]"
                 );
  }
  ppPVar2 = handle::ptr(&local_18);
  handle::handle(&local_58,(PyObject *)(*ppPVar2)[3].ob_refcnt);
  local_31._M_elems[3] =
       type_caster<float,_void>::load(this_03,local_58,(bool)(success._M_elems[0] & 1));
  this_04 = std::
            get<4ul,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::allocator<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>>,void>,pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>>
                      ((tuple<pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>,_void>,_pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_void>_>
                        *)this);
  ppPVar2 = handle::ptr(&local_18);
  iVar1 = PyType_HasFeature((*ppPVar2)->ob_type,0x4000000);
  if (iVar1 == 0) {
    __assert_fail("PyTuple_Check(src.ptr())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/cast.h"
                  ,0x300,
                  "bool pybind11::detail::type_caster<std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>>::load(handle, bool, index_sequence<Indices...>) [type = std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>, SFINAE = void, Indices = <0UL, 1UL, 2UL, 3UL, 4UL, 5UL, 6UL, 7UL>]"
                 );
  }
  ppPVar2 = handle::ptr(&local_18);
  handle::handle(&local_60,(PyObject *)(*ppPVar2)[3].ob_type);
  local_31._M_elems[4] =
       type_caster<float,_void>::load(this_04,local_60,(bool)(success._M_elems[0] & 1));
  this_05 = std::
            get<5ul,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::allocator<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>>,void>,pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>>
                      ((tuple<pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>,_void>,_pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_void>_>
                        *)this);
  ppPVar2 = handle::ptr(&local_18);
  iVar1 = PyType_HasFeature((*ppPVar2)->ob_type,0x4000000);
  if (iVar1 == 0) {
    __assert_fail("PyTuple_Check(src.ptr())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/cast.h"
                  ,0x300,
                  "bool pybind11::detail::type_caster<std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>>::load(handle, bool, index_sequence<Indices...>) [type = std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>, SFINAE = void, Indices = <0UL, 1UL, 2UL, 3UL, 4UL, 5UL, 6UL, 7UL>]"
                 );
  }
  ppPVar2 = handle::ptr(&local_18);
  handle::handle(&local_68,(PyObject *)(*ppPVar2)[4].ob_refcnt);
  local_31._M_elems[5] =
       type_caster<float,_void>::load(this_05,local_68,(bool)(success._M_elems[0] & 1));
  this_06 = std::
            get<6ul,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::allocator<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>>,void>,pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>>
                      ((tuple<pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>,_void>,_pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_void>_>
                        *)this);
  ppPVar2 = handle::ptr(&local_18);
  iVar1 = PyType_HasFeature((*ppPVar2)->ob_type,0x4000000);
  if (iVar1 == 0) {
    __assert_fail("PyTuple_Check(src.ptr())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/cast.h"
                  ,0x300,
                  "bool pybind11::detail::type_caster<std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>>::load(handle, bool, index_sequence<Indices...>) [type = std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>, SFINAE = void, Indices = <0UL, 1UL, 2UL, 3UL, 4UL, 5UL, 6UL, 7UL>]"
                 );
  }
  ppPVar2 = handle::ptr(&local_18);
  handle::handle(&local_70,(PyObject *)(*ppPVar2)[4].ob_type);
  local_31._M_elems[6] =
       list_caster<std::vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
       ::load(&this_06->
               super_list_caster<std::vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
              ,local_70,(bool)(success._M_elems[0] & 1));
  this_07 = std::
            get<7ul,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<std::vector<float,std::allocator<float>>,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::allocator<std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>>,void>,pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>,void>>
                      ((tuple<pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<std::vector<float,_std::allocator<float>_>,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<std::vector<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::allocator<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>,_void>,_pybind11::detail::type_caster<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_void>_>
                        *)this);
  ppPVar2 = handle::ptr(&local_18);
  iVar1 = PyType_HasFeature((*ppPVar2)->ob_type,0x4000000);
  if (iVar1 != 0) {
    ppPVar2 = handle::ptr(&local_18);
    handle::handle((handle *)&__range3,(PyObject *)(*ppPVar2)[5].ob_refcnt);
    local_31._M_elems[7] =
         list_caster<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
         ::load(&this_07->
                 super_list_caster<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ,(handle)__range3,(bool)(success._M_elems[0] & 1));
    __end0 = std::array<bool,_8UL>::begin(&local_31);
    pvVar3 = std::array<bool,_8UL>::end(&local_31);
    while( true ) {
      if (__end0 == pvVar3) {
        return true;
      }
      if ((*__end0 & 1U) == 0) break;
      __end0 = __end0 + 1;
    }
    return false;
  }
  __assert_fail("PyTuple_Check(src.ptr())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/okdshin[P]Yender/pybind11/include/pybind11/cast.h"
                ,0x300,
                "bool pybind11::detail::type_caster<std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>>::load(handle, bool, index_sequence<Indices...>) [type = std::tuple<int, int, const std::vector<float> &, float, float, float, const std::vector<std::vector<std::vector<float>>> &, const std::vector<std::vector<unsigned char>> &>, SFINAE = void, Indices = <0UL, 1UL, 2UL, 3UL, 4UL, 5UL, 6UL, 7UL>]"
               );
}

Assistant:

bool load(handle src, bool convert, index_sequence<Indices...>) {
        std::array<bool, size> success {{
            std::get<Indices>(value).load(PyTuple_GET_ITEM(src.ptr(), Indices), convert)...
        }};
        (void) convert; /* avoid a warning when the tuple is empty */
        for (bool r : success)
            if (!r)
                return false;
        return true;
    }